

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void SQCollectable::RemoveFromChain(SQCollectable_conflict **chain,SQCollectable_conflict *c)

{
  SQCollectable_conflict *pSVar1;
  SQCollectable_conflict **ppSVar2;
  
  pSVar1 = c->_next;
  ppSVar2 = &c->_prev->_next;
  if (c->_prev == (SQCollectable_conflict *)0x0) {
    ppSVar2 = chain;
  }
  *ppSVar2 = pSVar1;
  if (pSVar1 != (SQCollectable_conflict *)0x0) {
    pSVar1->_prev = c->_prev;
  }
  c->_next = (SQCollectable_conflict *)0x0;
  c->_prev = (SQCollectable_conflict *)0x0;
  return;
}

Assistant:

void SQCollectable::RemoveFromChain(SQCollectable **chain,SQCollectable *c)
{
    if(c->_prev) c->_prev->_next = c->_next;
    else *chain = c->_next;
    if(c->_next)
        c->_next->_prev = c->_prev;
    c->_next = NULL;
    c->_prev = NULL;
}